

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send_message(Curl_easy *data,uchar cmd,void *msg,size_t msg_len)

{
  CURLcode result;
  size_t msg_len_local;
  void *msg_local;
  uchar cmd_local;
  Curl_easy *data_local;
  
  data_local._4_4_ = Curl_get_upload_buffer(data);
  if (data_local._4_4_ == CURLE_OK) {
    smb_format_message(data,(smb_header *)(data->state).ulbuf,cmd,msg_len);
    memcpy((data->state).ulbuf + 0x24,msg,msg_len);
    data_local._4_4_ = smb_send(data,msg_len + 0x24,0);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smb_send_message(struct Curl_easy *data, unsigned char cmd,
                                 const void *msg, size_t msg_len)
{
  CURLcode result = Curl_get_upload_buffer(data);
  if(result)
    return result;
  smb_format_message(data, (struct smb_header *)data->state.ulbuf,
                     cmd, msg_len);
  memcpy(data->state.ulbuf + sizeof(struct smb_header),
         msg, msg_len);

  return smb_send(data, sizeof(struct smb_header) + msg_len, 0);
}